

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameColumnExprCb(Walker *pWalker,Expr *pExpr)

{
  RenameCtx *pCtx;
  RenameCtx *p;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  pCtx = (pWalker->u).pRename;
  if (((pExpr->op == 'M') && ((int)pExpr->iColumn == pCtx->iCol)) &&
     (pWalker->pParse->pTriggerTab == pCtx->pTab)) {
    renameTokenFind(pWalker->pParse,pCtx,pExpr);
  }
  else if (((pExpr->op == 0xa7) && ((int)pExpr->iColumn == pCtx->iCol)) &&
          (((pExpr->flags & 0x3000000) == 0 && (pCtx->pTab == (pExpr->y).pTab)))) {
    renameTokenFind(pWalker->pParse,pCtx,pExpr);
  }
  return 0;
}

Assistant:

static int renameColumnExprCb(Walker *pWalker, Expr *pExpr){
  RenameCtx *p = pWalker->u.pRename;
  if( pExpr->op==TK_TRIGGER
   && pExpr->iColumn==p->iCol
   && pWalker->pParse->pTriggerTab==p->pTab
  ){
    renameTokenFind(pWalker->pParse, p, (void*)pExpr);
  }else if( pExpr->op==TK_COLUMN
   && pExpr->iColumn==p->iCol
   && ALWAYS(ExprUseYTab(pExpr))
   && p->pTab==pExpr->y.pTab
  ){
    renameTokenFind(pWalker->pParse, p, (void*)pExpr);
  }
  return WRC_Continue;
}